

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O2

void __thiscall
covec::Covec<float>::
initialize<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (Covec<float> *this,
          vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          *probs,mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *gen,size_t dim,float sigma,size_t neg_size,float eta0,float eta1,
          bool enable_chopout,vector<unsigned_long,_std::allocator<unsigned_long>_> *share)

{
  pointer puVar1;
  pointer psVar2;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *this_00;
  size_t sVar3;
  pointer psVar4;
  pointer psVar5;
  pointer psVar6;
  size_t i;
  ulong uVar7;
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  *pvVar8;
  undefined3 in_register_00000089;
  size_t j;
  undefined8 *puVar9;
  size_type __n;
  size_t counter;
  unsigned_long uVar10;
  size_t sVar11;
  Covec<float> *pCVar12;
  size_type __new_size;
  long lVar13;
  result_type_conflict rVar14;
  reference rVar15;
  size_t num_entries;
  allocator_type local_c9;
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_c8;
  long local_c0;
  Covec<float> *local_b8;
  vector<float,_std::allocator<float>_> v;
  __shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_90;
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  *local_80;
  size_type local_78;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  *local_70;
  vector<bool,_std::allocator<bool>_> first_of_sharings;
  normal_distribution<float> normal;
  
  local_b8 = (Covec<float> *)CONCAT44(local_b8._4_4_,CONCAT31(in_register_00000089,enable_chopout));
  local_c0 = CONCAT44(local_c0._4_4_,eta1);
  local_c8 = (vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)CONCAT44(local_c8._4_4_,eta0);
  local_70 = &this->probs_;
  std::
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  ::operator=(local_70,probs);
  this->dim_ = dim;
  this->neg_size_ = neg_size;
  this->eta0_ = local_c8._0_4_;
  this->eta1_ = (float)local_c0;
  this->chopout_enabled_ = SUB81(local_b8,0);
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._12_4_ = 0;
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->keep_dim_,&first_of_sharings);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&first_of_sharings);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->share_,share);
  std::vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
  clear(&this->num_entries_);
  local_80 = &this->vs_;
  std::
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ::clear(local_80);
  local_c8 = &this->cs_;
  local_b8 = this;
  std::
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::clear(local_c8);
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._8_8_ =
       first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  uVar10 = 0;
  for (uVar7 = 0; pvVar8 = local_80, pCVar12 = local_b8,
      uVar7 < (ulong)((long)(probs->
                            super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(probs->
                            super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar7 = uVar7 + 1) {
    puVar1 = (share->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((puVar1 == (share->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish) || (puVar1[uVar7] == uVar10)) {
      std::vector<bool,_std::allocator<bool>_>::push_back(&first_of_sharings,true);
      uVar10 = uVar10 + 1;
    }
    else {
      std::vector<bool,_std::allocator<bool>_>::push_back(&first_of_sharings,false);
    }
  }
  __new_size = (long)(local_b8->probs_).
                     super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_b8->probs_).
                     super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ::resize(local_80,__new_size);
  std::
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::resize(local_c8,__new_size);
  std::vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
  resize(&pCVar12->num_entries_,__new_size);
  normal._M_param._M_mean = 0.0;
  normal._M_saved = 0.0;
  normal._M_saved_available = false;
  local_78 = __new_size;
  normal._M_param._M_stddev = sigma;
  for (__n = 0; __n != local_78; __n = __n + 1) {
    rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](&first_of_sharings,__n);
    if ((*rVar15._M_p & rVar15._M_mask) == 0) {
      psVar4 = (pCVar12->vs_).
               super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      __shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&psVar4[__n].
                   super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ,&psVar4[(pCVar12->share_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[__n]].
                    super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 );
      psVar5 = (pCVar12->num_entries_).
               super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&psVar5[__n].super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>,
                 &psVar5[(pCVar12->share_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[__n]].
                  super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>);
      psVar6 = (pCVar12->cs_).
               super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&psVar6[__n].
                   super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ,&psVar6[(pCVar12->share_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[__n]].
                    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 );
    }
    else {
      psVar2 = (local_70->
               super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_c0 = __n * 0x10;
      std::discrete_distribution<int>::probabilities
                ((vector<double,_std::allocator<double>_> *)&v,
                 psVar2[__n].
                 super___shared_ptr<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      num_entries = (long)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3;
      std::make_shared<unsigned_long,unsigned_long>((unsigned_long *)&local_90);
      puVar9 = (undefined8 *)
               ((long)&(psVar2->
                       super___shared_ptr<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr + local_c0);
      std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(((pCVar12->num_entries_).
                           super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 local_c0),(__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&v);
      std::discrete_distribution<int>::probabilities
                ((vector<double,_std::allocator<double>_> *)&v,(discrete_distribution<int> *)*puVar9
                );
      lVar13 = (long)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&v);
      num_entries = lVar13 >> 3;
      std::vector<float,_std::allocator<float>_>::vector(&v,pCVar12->dim_,&local_c9);
      std::
      make_shared<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,unsigned_long&,std::vector<float,std::allocator<float>>>
                ((unsigned_long *)&local_90,(vector<float,_std::allocator<float>_> *)&num_entries);
      lVar13 = local_c0;
      std::
      __shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=((__shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)((long)&(((pvVar8->
                               super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + local_c0),&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&v);
      std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>,unsigned_long&>
                ((unsigned_long *)&v);
      std::
      __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=((__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)((long)&(((local_c8->
                               super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar13),
                  (__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      this_00 = *(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  **)((long)&(((pvVar8->
                               super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar13);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::resize(this_00,num_entries);
      for (uVar7 = 0; pCVar12 = local_b8, uVar7 < num_entries; uVar7 = uVar7 + 1) {
        std::vector<float,_std::allocator<float>_>::vector
                  (&v,local_b8->dim_,(allocator_type *)&local_90);
        sVar3 = pCVar12->dim_;
        for (sVar11 = 0; sVar3 != sVar11; sVar11 = sVar11 + 1) {
          rVar14 = std::normal_distribution<float>::operator()(&normal,gen);
          v.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar11] = rVar14;
        }
        std::vector<float,_std::allocator<float>_>::operator=
                  ((this_00->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar7,
                   (vector<float,_std::allocator<float>_> *)
                   &v.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&v.super__Vector_base<float,_std::allocator<float>_>);
      }
      local_90._M_ptr._0_4_ = 0;
      std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>,unsigned_long&,int>
                ((unsigned_long *)&v,(int *)&num_entries);
      std::
      __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=((__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)((long)&(((local_c8->
                               super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + local_c0),
                  (__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &v.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      pvVar8 = local_80;
      pCVar12 = local_b8;
    }
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&first_of_sharings.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

void Covec<Real>::initialize(const std::vector<std::shared_ptr<std::discrete_distribution<int> > >& probs,
                               RandomGenerator& gen,
                               const std::size_t dim,
                               const Real sigma,
                               const std::size_t neg_size,
                               const Real eta0,
                               const Real eta1,
			       const bool enable_chopout,
                               const std::vector<std::size_t>& share
                               )
  {
    this->probs_ = probs;
    this->dim_ = dim;
    this->neg_size_ = neg_size;
    this->eta0_ = eta0;
    this->eta1_ = eta1;
    this->chopout_enabled_ = enable_chopout;
    this->keep_dim_ = std::vector<std::size_t>();
    this->share_ = share;

    this->num_entries_.clear();
    this->vs_.clear();
    this->cs_.clear();

    std::vector<bool> first_of_sharings;
    {
      std::size_t counter=0;
      for(std::size_t i=0; i < probs.size(); ++i){
        if(share.empty() || share[i] == counter){
          first_of_sharings.push_back(true);
          ++counter;
        }else{
          first_of_sharings.push_back(false);
        }
      }
    }

    std::size_t order = this->probs_.size();
    this->vs_.resize(order);
    this->cs_.resize(order);
    this->num_entries_.resize(order);
    std::normal_distribution<Real> normal(0.0, sigma);
    for(std::size_t i = 0; i < order; ++i){
      if(!first_of_sharings[i]){
        assert(this->probs_[i] == this->probs_[this->share_[i]]);
        this->vs_[i] = this->vs_[this->share_[i]];
        this->num_entries_[i] = this->num_entries_[this->share_[i]];
        this->cs_[i] = this->cs_[this->share_[i]];
      }else{
        const auto& prob = this->probs_[i];

        // allocate
        this->num_entries_[i] =
          std::make_shared<std::size_t>(prob->probabilities().size());
        std::size_t num_entries = prob->probabilities().size();
        this->vs_[i] =
          std::make_shared<std::vector<std::vector<Real> > >
          (num_entries, std::vector<Real>(this->dimension()));
        this->cs_[i] =
          std::make_shared<std::vector<std::size_t> >(num_entries);
	   
        auto& vs = *this->vs_[i];
        vs.resize(num_entries);
        for(std::size_t j = 0; j < num_entries; ++j){
          std::vector<Real> v(this->dim_);
          for(std::size_t k = 0, K = this->dimension(); k < K; ++k){
            v[k] = normal(gen);
          }
          vs[j] = v;
        }
        this->cs_[i] = std::make_shared<std::vector<std::size_t> >(num_entries, 0);
      }
    }
  }